

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6_Apu.cpp
# Opt level: O3

void __thiscall Nes_Vrc6_Apu::run_square(Nes_Vrc6_Apu *this,Vrc6_Osc *osc,blip_time_t end_time)

{
  byte bVar1;
  blip_time_t t;
  Blip_Buffer *buf;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint delta;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  buf = osc->output;
  if (buf != (Blip_Buffer *)0x0) {
    buf->modified_ = 1;
    bVar1 = osc->regs[0];
    uVar6 = bVar1 & 0xf;
    bVar2 = osc->regs[2];
    if (-1 < (char)bVar2) {
      uVar6 = 0;
    }
    uVar7 = bVar1 >> 4 & 7;
    uVar5 = 0;
    if (osc->phase <= (int)uVar7) {
      uVar5 = uVar6;
    }
    if ((char)bVar1 < '\0') {
      uVar5 = uVar6;
    }
    t = this->last_time;
    iVar4 = uVar5 - osc->last_amp;
    if (iVar4 != 0) {
      osc->last_amp = uVar5;
      Blip_Synth<12,_1>::offset(&this->square_synth,t,iVar4,buf);
      bVar2 = osc->regs[2];
    }
    iVar4 = t + osc->delay;
    osc->delay = 0;
    if (((-1 < (char)bVar1) && (uVar6 != 0)) &&
       (uVar5 = (uint)osc->regs[1] + (uint)(bVar2 & 0xf) * 0x100 + 1, 4 < uVar5)) {
      if (iVar4 < end_time) {
        uVar3 = osc->phase;
        do {
          uVar8 = uVar3 + 1;
          if (uVar8 == 0x10) {
            uVar8 = 0;
            uVar3 = uVar6;
            delta = uVar6;
LAB_0059957d:
            osc->last_amp = uVar3;
            Blip_Synth<12,_1>::offset(&this->square_synth,iVar4,delta,buf);
            uVar3 = uVar8;
          }
          else {
            bVar9 = uVar3 == uVar7;
            uVar3 = uVar8;
            if (bVar9) {
              uVar3 = 0;
              delta = -uVar6;
              goto LAB_0059957d;
            }
          }
          iVar4 = iVar4 + uVar5;
        } while (iVar4 < end_time);
        osc->phase = uVar3;
      }
      osc->delay = iVar4 - end_time;
    }
  }
  return;
}

Assistant:

void Nes_Vrc6_Apu::run_square( Vrc6_Osc& osc, blip_time_t end_time )
{
	Blip_Buffer* output = osc.output;
	if ( !output )
		return;
	output->set_modified();
	
	int volume = osc.regs [0] & 15;
	if ( !(osc.regs [2] & 0x80) )
		volume = 0;
	
	int gate = osc.regs [0] & 0x80;
	int duty = ((osc.regs [0] >> 4) & 7) + 1;
	int delta = ((gate || osc.phase < duty) ? volume : 0) - osc.last_amp;
	blip_time_t time = last_time;
	if ( delta )
	{
		osc.last_amp += delta;
		square_synth.offset( time, delta, output );
	}
	
	time += osc.delay;
	osc.delay = 0;
	int period = osc.period();
	if ( volume && !gate && period > 4 )
	{
		if ( time < end_time )
		{
			int phase = osc.phase;
			
			do
			{
				phase++;
				if ( phase == 16 )
				{
					phase = 0;
					osc.last_amp = volume;
					square_synth.offset( time, volume, output );
				}
				if ( phase == duty )
				{
					osc.last_amp = 0;
					square_synth.offset( time, -volume, output );
				}
				time += period;
			}
			while ( time < end_time );
			
			osc.phase = phase;
		}
		osc.delay = time - end_time;
	}
}